

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uint __thiscall IDisk::GetTrackInfo(IDisk *this,MFMTrack *mfm_track,Track *track_buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uchar uVar5;
  byte bVar6;
  ushort uVar7;
  unsigned_short uVar8;
  int iVar9;
  byte *pbVar10;
  size_type sVar11;
  reference pvVar12;
  bool bVar13;
  byte local_161;
  uint local_150;
  uint local_14c;
  uint i_1;
  uint finalsize;
  uint uStack_140;
  bool whole_track_recorded;
  uint max_index;
  uint offset_end;
  int gap_3_total;
  int data_count;
  uchar local_12c;
  byte local_12b;
  ushort local_12a;
  int sectorsize;
  uchar byte;
  bool data_found;
  unsigned_short crc;
  Sector sector;
  int local_f4;
  int i;
  undefined1 local_e8 [3];
  bool sync_ok;
  char pattern_f [56];
  undefined1 local_a8 [8];
  char pattern_fe [64];
  uint local_5c;
  undefined1 local_58 [4];
  uint index;
  CRC crc_local;
  uint size;
  Track *track_buffer_local;
  MFMTrack *mfm_track_local;
  IDisk *this_local;
  
  CRC::CRC((CRC *)local_58);
  crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x100;
  local_5c = 0;
  memcpy(local_a8,&DAT_00275a50,0x40);
  memcpy(local_e8,&DAT_00275a90,0x38);
  if (mfm_track->size < 0x40) {
    this_local._4_4_ = 0;
  }
  else {
    while (local_5c < mfm_track->size - 0x40) {
      bVar13 = 0x50 < local_5c;
      if (bVar13) {
        iVar9 = memcmp(local_a8,mfm_track->bitfield + local_5c,0x40);
        bVar13 = iVar9 == 0;
        if (bVar13) {
          local_f4 = 0;
          while( true ) {
            bVar4 = false;
            if (local_f4 < 0x28) {
              bVar4 = bVar13;
            }
            if (!bVar4) break;
            if ((mfm_track->bitfield[(local_5c - 0x50) + local_f4 * 2] != '\x01') ||
               (mfm_track->bitfield[(local_5c + local_f4 * 2) - 0x4f] != '\0')) {
              bVar13 = false;
            }
            local_f4 = local_f4 + 1;
          }
        }
      }
      if (bVar13) {
        CRC::Reset((CRC *)local_58);
        CRC::AddByteToCrc((CRC *)local_58,0xa1);
        CRC::AddByteToCrc((CRC *)local_58,0xa1);
        CRC::AddByteToCrc((CRC *)local_58,0xa1);
        CRC::AddByteToCrc((CRC *)local_58,0xfe);
        sector.c = '\0';
        sector.h = '\0';
        sector.r = '\0';
        sector.n = '\0';
        sector.chrn_crc_ok = false;
        sector.status1 = '\0';
        sector.status2 = '\0';
        sector._15_1_ = 0;
        sector.real_size = 0;
        sector._18_2_ = 0;
        sector.dam_offset = 0;
        sector.idam_offset = 0;
        sector.idam_sync_offset = 0;
        sector.dam_sync_offset = 0;
        _byte = local_5c - 0x50;
        sectorsize = local_5c;
        uVar5 = GetNextByte(this,mfm_track,local_5c + 0x40);
        sector.idam_offset._0_1_ = uVar5;
        CRC::AddByteToCrc((CRC *)local_58,uVar5);
        uVar5 = GetNextByte(this,mfm_track,local_5c + 0x50);
        sector.idam_offset._1_1_ = uVar5;
        CRC::AddByteToCrc((CRC *)local_58,uVar5);
        uVar5 = GetNextByte(this,mfm_track,local_5c + 0x60);
        sector.idam_offset._2_1_ = uVar5;
        CRC::AddByteToCrc((CRC *)local_58,uVar5);
        uVar5 = GetNextByte(this,mfm_track,local_5c + 0x70);
        sector.idam_offset._3_1_ = uVar5;
        CRC::AddByteToCrc((CRC *)local_58,uVar5);
        if (this->log_ != (ILog *)0x0) {
          (*(code *)**(undefined8 **)this->log_)(this->log_,"CHRN Found");
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 8))(this->log_,sector._0_8_ & 0xff);
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._1_1_);
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._2_1_);
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._3_1_);
        }
        bVar6 = GetNextByte(this,mfm_track,local_5c + 0x80);
        local_12a = (ushort)bVar6 << 8;
        bVar6 = GetNextByte(this,mfm_track,local_5c + 0x90);
        uVar7 = local_12a | bVar6;
        local_5c = local_5c + 0xa0;
        local_12a = uVar7;
        uVar8 = CRC::GetCRC((CRC *)local_58);
        if ((uVar7 != uVar8) &&
           (sector._0_8_ = sector._0_8_ | 0x200000000000, this->log_ != (ILog *)0x0)) {
          (*(code *)**(undefined8 **)this->log_)(this->log_,"HEADER CRC ERROR !");
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 0x20))();
        }
        local_12b = 0;
        while( true ) {
          local_161 = 0;
          if (local_5c < mfm_track->size - 0x38) {
            local_161 = local_12b ^ 0xff;
          }
          if ((local_161 & 1) == 0) break;
          iVar9 = memcmp(local_e8,mfm_track->bitfield + local_5c,0x38);
          if (iVar9 == 0) {
            local_12b = 1;
            sector.chrn_crc_ok = (bool)(undefined1)local_5c;
            sector.status1 = local_5c._1_1_;
            sector.status2 = local_5c._2_1_;
            sector._15_1_ = local_5c._3_1_;
            sector._16_4_ = local_5c - 0x50;
            CRC::Reset((CRC *)local_58);
            CRC::AddByteToCrc((CRC *)local_58,0xa1);
            CRC::AddByteToCrc((CRC *)local_58,0xa1);
            CRC::AddByteToCrc((CRC *)local_58,0xa1);
            local_12c = GetNextByte(this,mfm_track,local_5c + 0x30);
            CRC::AddByteToCrc((CRC *)local_58,local_12c);
            local_5c = local_5c + 0x40;
            if (local_12c == 0xf8) {
              sector._0_8_ = sector._0_8_ | 0x40000000000000;
            }
            gap_3_total._3_1_ = 8;
            pbVar10 = std::min<unsigned_char>
                                ((uchar *)((long)&sector.idam_offset + 3),
                                 (uchar *)((long)&gap_3_total + 3));
            data_count = 0x80 << (*pbVar10 & 0x1f);
            for (offset_end = 0; (int)offset_end < data_count; offset_end = offset_end + 1) {
              local_12c = GetNextByte(this,mfm_track,local_5c);
              CRC::AddByteToCrc((CRC *)local_58,local_12c);
              local_5c = local_5c + 0x10;
              if (mfm_track->size <= local_5c) {
                local_5c = local_5c - mfm_track->size;
              }
              sector._8_2_ = sector._8_2_ + 1;
            }
            if (local_5c < mfm_track->size - 0x20) {
              bVar6 = GetNextByte(this,mfm_track,local_5c);
              local_12a = (ushort)bVar6 << 8;
              bVar6 = GetNextByte(this,mfm_track,local_5c + 0x10);
              local_12a = local_12a | bVar6;
              local_5c = local_5c + 0x20;
            }
            uVar7 = local_12a;
            uVar8 = CRC::GetCRC((CRC *)local_58);
            if ((uVar7 != uVar8) &&
               (sector._0_8_ = sector._0_8_ | 0x20200000000000, this->log_ != (ILog *)0x0)) {
              (*(code *)**(undefined8 **)this->log_)(this->log_,"DATA CRC ERROR !");
            }
            if (this->log_ != (ILog *)0x0) {
              (**(code **)(*(long *)this->log_ + 0x20))();
            }
            sector.dam_sync_offset = local_5c;
            std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::push_back
                      (&track_buffer->list_sector_,(value_type *)&sectorsize);
            crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 (uint)(ushort)sector._8_2_ +
                 crc_local.crc_stack_.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
            local_5c = sector._12_4_ + 0x41;
          }
          else {
            local_5c = local_5c + 1;
          }
        }
      }
      else {
        local_5c = local_5c + 1;
      }
    }
    max_index = 0;
    uStack_140 = 0;
    finalsize = 0;
    bVar13 = false;
    local_14c = 0x100;
    sVar11 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                       (&track_buffer->list_sector_);
    if (sVar11 == 0) {
      track_buffer->full_size_ = 0;
    }
    else {
      for (local_150 = 0;
          sVar11 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                             (&track_buffer->list_sector_), local_150 < sVar11;
          local_150 = local_150 + 1) {
        if (local_150 != 0) {
          pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                              (&track_buffer->list_sector_,(ulong)local_150);
          max_index = ((pvVar12->idam_offset - 0x18) - uStack_140) + max_index;
        }
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        uVar1 = pvVar12->dam_offset;
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        if (((uVar1 + 0x24 + (uint)pvVar12->real_size * 0x10 <= finalsize) || (bVar13)) ||
           (pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150),
           0xffff < local_14c + pvVar12->real_size)) {
          sVar11 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                             (&track_buffer->list_sector_);
          if ((sVar11 < 2) ||
             (sVar11 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                                 (&track_buffer->list_sector_), sVar11 - 1 <= (ulong)local_150)) {
            uVar1 = mfm_track->size;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            uVar2 = pvVar12->dam_offset;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,0);
            uVar3 = pvVar12->idam_offset;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            pvVar12->real_size = (unsigned_short)((uVar1 - uVar2) + uVar3 + 100 >> 4);
          }
          else {
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            uVar1 = pvVar12->dam_offset;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            uVar7 = pvVar12->real_size;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)(local_150 + 1));
            if (pvVar12->idam_offset + 0xa0 < uVar1 + 0x24 + (uint)uVar7 * 0x10) {
              pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                  (&track_buffer->list_sector_,(ulong)(local_150 + 1));
              uVar1 = pvVar12->idam_offset;
              pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                  (&track_buffer->list_sector_,(ulong)local_150);
              pvVar12->index_end = uVar1 + 0xa0;
              pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                  (&track_buffer->list_sector_,(ulong)local_150);
              uVar1 = pvVar12->index_end;
              pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                  (&track_buffer->list_sector_,(ulong)local_150);
              uVar2 = pvVar12->dam_offset;
              pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                  (&track_buffer->list_sector_,(ulong)local_150);
              pvVar12->real_size = (unsigned_short)(uVar1 - (uVar2 + 0x30) >> 4);
            }
          }
        }
        else {
          pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                              (&track_buffer->list_sector_,(ulong)local_150);
          uVar1 = pvVar12->dam_offset;
          pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                              (&track_buffer->list_sector_,(ulong)local_150);
          if (mfm_track->size < uVar1 + 0x24 + (uint)pvVar12->real_size * 0x10) {
            uVar1 = mfm_track->size;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            uVar2 = pvVar12->dam_offset;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,0);
            uVar3 = pvVar12->idam_offset;
            pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                                (&track_buffer->list_sector_,(ulong)local_150);
            pvVar12->real_size = (unsigned_short)((uVar1 - (uVar2 + 0x24)) + uVar3 + 0x40 >> 4);
            bVar13 = true;
          }
          pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                              (&track_buffer->list_sector_,(ulong)local_150);
          finalsize = pvVar12->index_end;
        }
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        uVar1 = pvVar12->dam_offset;
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        if (mfm_track->size < uVar1 + 0x24 + (uint)pvVar12->real_size * 0x10) {
          bVar13 = true;
        }
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        local_14c = pvVar12->real_size + local_14c;
        pvVar12 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_150);
        uStack_140 = pvVar12->index_end;
      }
      sVar11 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                         (&track_buffer->list_sector_);
      track_buffer->gap3_size_ = (int)((ulong)(long)((int)max_index / 0x10) / sVar11);
      if ((local_14c & 0xffffff00) < local_14c) {
        local_14c = local_14c + 0x100;
      }
      track_buffer->full_size_ = local_14c;
    }
    this_local._4_4_ = local_14c;
  }
  CRC::~CRC((CRC *)local_58);
  return this_local._4_4_;
}

Assistant:

unsigned int IDisk::GetTrackInfo(MFMTrack* mfm_track, Track* track_buffer)
{
   unsigned int size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   if (mfm_track->size < (int)sizeof(pattern_fe))
   {
      return 0;
   }
   while (index < mfm_track->size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > SYNC_BIT_NUMBER * 2);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &mfm_track->bitfield[index], sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }

      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("CHRN Found");
         LOGB(sector.c );
         LOGB(sector.h );
         LOGB(sector.r );
         LOGB(sector.n );

         // Do we have CRC error ?
         unsigned short crc = GetNextByte(mfm_track, index);
         crc <<= 8;
         index += 16;
         crc |= GetNextByte(mfm_track, index);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < mfm_track->size - (int)sizeof(pattern_f)) && (!data_found))
         {
            if (memcmp(pattern_f, &mfm_track->bitfield[index], sizeof(pattern_f)) == 0)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2; // todo : Add verify

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByte(mfm_track, index);
               crc_local.AddByteToCrc(byte);
               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sectorsize = (0x80 << (std::min(sector.n, (unsigned char)0x8)));
               for (int data_count = 0;
                    data_count < sectorsize; data_count++)
               {
                  byte = GetNextByte(mfm_track, index);
                  crc_local.AddByteToCrc(byte);
                  index += 16;
                  if (index >= mfm_track->size)
                  {
                     index = index - mfm_track->size;
                  }

                  sector.real_size++;
               }
               if (index < mfm_track->size - 32)
               {
                  // CRC Check
                  crc = GetNextByte(mfm_track, index);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByte(mfm_track, index);
                  index += 16;
               }
               else
               {
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               index = sector.dam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   unsigned int offset_end = 0;
   unsigned int max_index = 0;
   bool whole_track_recorded = false;
   unsigned int finalsize = 256;

   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }

         // check size :
         //if ( track_buffer->listSector.size() > 1 && i < track_buffer->listSector.size()-1 )
         {
            // Interlaced sector :
            // Add full sector if :
            // - MaxIndex < endIndex (AND whole track is not recorded)
            // - totalsize + RealSize < 0x10000 (otherwise = problem with dsk header)
            if (max_index < track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16
               && !whole_track_recorded
               && (finalsize + track_buffer->list_sector_[i].real_size) < 0x10000)
            {
               if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
               {
                  // Skip to first IDAM found
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - (track_buffer->list_sector_[i
                  ].dam_offset + 0x24) + track_buffer->list_sector_[0].idam_offset + 64) / 16);
                  whole_track_recorded = true;
               }
               max_index = track_buffer->list_sector_[i].index_end;
            }
               // Otherwise :
               // Add until IDAMOffset + 160 bye ( 4 for idam, 4 for chrn, 4 for CRC)
            else
            {
               if (track_buffer->list_sector_.size() > 1 && i < track_buffer->list_sector_.size() - 1)
               {
                  if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > track_buffer->
                     list_sector_[i + 1].idam_offset + 160)
                  {
                     //track_buffer->listSector[i].RealSize -= (track_buffer->listSector[i].indexEnd - (track_buffer->listSector[i+1].IDAMOffset + 160))/16;
                     track_buffer->list_sector_[i].index_end = track_buffer->list_sector_[i + 1].idam_offset + 160;
                     track_buffer->list_sector_[i].real_size = (track_buffer->list_sector_[i].index_end - (track_buffer->list_sector_[i].
                        dam_offset + (3 * 16))) / 16;
                  }
               }
               else
               {
                  // Last track : go until begining of first sector
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - track_buffer->list_sector_[i]
                     .dam_offset + 0x24 + track_buffer->list_sector_[0].idam_offset + 64) / 16);
               }
            }
            if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
            {
               whole_track_recorded = true;
            }
         }
         finalsize += track_buffer->list_sector_[i].real_size;

         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += trackIn->Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((finalsize & 0xFFFFFF00) < finalsize)
      {
         finalsize += 0x100;
      }
      track_buffer->full_size_ = finalsize;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return finalsize;
}